

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,Point2f u)

{
  undefined8 uVar1;
  bool bVar2;
  Transform *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Point3f local_94;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Tuple3<pbrt::Vector3,_float> local_68;
  Float local_58;
  Float FStack_54;
  Float FStack_50;
  Float FStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Point3fi local_38;
  undefined1 extraout_var [60];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar8._0_16_,
                           SUB6416(ZEXT464(0x3f800000),0));
  local_78._0_4_ = auVar4._0_4_;
  auVar4 = vfnmadd213ss_fma(auVar4,auVar4,SUB6416(ZEXT464(0x3f800000),0));
  auVar4 = vmaxss_avx(auVar4,ZEXT816(0));
  local_88 = vsqrtss_avx(auVar4,auVar4);
  auVar4 = vmovshdup_avx(auVar8._0_16_);
  fVar5 = auVar4._0_4_ * 6.2831855;
  local_58 = this->radius;
  FStack_54 = local_58;
  FStack_50 = local_58;
  FStack_4c = local_58;
  local_48 = cosf(fVar5);
  uStack_44 = extraout_XMM0_Db;
  uStack_40 = extraout_XMM0_Dc;
  uStack_3c = extraout_XMM0_Dd;
  auVar9._0_4_ = sinf(fVar5);
  auVar9._4_60_ = extraout_var;
  local_94.super_Tuple3<pbrt::Point3,_float>.z = local_58 * (float)local_78._0_4_ + 0.0;
  auVar4._4_4_ = uStack_44;
  auVar4._0_4_ = local_48;
  auVar4._8_4_ = uStack_40;
  auVar4._12_4_ = uStack_3c;
  auVar4 = vinsertps_avx(auVar4,auVar9._0_16_,0x10);
  fVar5 = local_58 * (float)local_88._0_4_ * auVar4._0_4_ + 0.0;
  fVar10 = FStack_54 * (float)local_88._0_4_ * auVar4._4_4_ + 0.0;
  fVar11 = FStack_50 * (float)local_88._0_4_ * auVar4._8_4_ + 0.0;
  fVar12 = FStack_4c * (float)local_88._0_4_ * auVar4._12_4_ + 0.0;
  auVar19._0_4_ = fVar5 * fVar5;
  auVar19._4_4_ = fVar10 * fVar10;
  auVar19._8_4_ = fVar11 * fVar11;
  auVar19._12_4_ = fVar12 * fVar12;
  auVar4 = vhaddps_avx(auVar19,auVar19);
  auVar4 = ZEXT416((uint)(local_94.super_Tuple3<pbrt::Point3,_float>.z *
                          local_94.super_Tuple3<pbrt::Point3,_float>.z + auVar4._0_4_));
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  fVar14 = this->radius / auVar4._0_4_;
  local_94.super_Tuple3<pbrt::Point3,_float>.z =
       local_94.super_Tuple3<pbrt::Point3,_float>.z * fVar14;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar6._0_4_ = fVar5 * fVar14;
  auVar6._4_4_ = fVar10 * fVar14;
  auVar6._8_4_ = fVar11 * fVar14;
  auVar6._12_4_ = fVar12 * fVar14;
  auVar21._4_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar21._0_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar21._8_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar21._12_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar17 = vmovshdup_avx(auVar6);
  local_94.super_Tuple3<pbrt::Point3,_float>.y = auVar17._0_4_;
  auVar4 = vandps_avx(auVar6,auVar15);
  auVar7 = vandps_avx(auVar21,auVar15);
  auVar3._8_4_ = 0x34a00003;
  auVar3._0_8_ = 0x34a0000334a00003;
  auVar3._12_4_ = 0x34a00003;
  auVar4 = vmulps_avx512vl(auVar4,auVar3);
  local_68.z = auVar7._0_4_ * 2.980233e-07;
  local_68._0_8_ = vmovlps_avx(auVar4);
  this_00 = this->renderFromObject;
  bVar2 = this->reverseOrientation;
  uVar1 = *(undefined8 *)(this_00->mInv).m[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(this_00->mInv).m[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(this_00->mInv).m[2];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_94.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this_00->mInv).m[1][2])),auVar6,
                           ZEXT416((uint)(this_00->mInv).m[0][2]));
  auVar7._4_4_ = auVar6._0_4_;
  auVar7._0_4_ = auVar6._0_4_;
  auVar7._8_4_ = auVar6._0_4_;
  auVar7._12_4_ = auVar6._0_4_;
  auVar3 = vfmadd231ss_fma(auVar4,ZEXT416((uint)local_94.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this_00->mInv).m[2][2]));
  auVar16._0_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.y * (float)uVar1;
  auVar16._4_4_ = auVar17._4_4_ * (float)((ulong)uVar1 >> 0x20);
  auVar16._8_4_ = auVar17._8_4_ * 0.0;
  auVar16._12_4_ = auVar17._12_4_ * 0.0;
  auVar4 = vfmadd213ps_fma(auVar7,auVar20,auVar16);
  auVar7 = vfmadd231ps_fma(auVar4,auVar21,auVar22);
  fVar10 = auVar3._0_4_;
  auVar17._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar17._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar17._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar17._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar4 = vhaddps_avx(auVar17,auVar17);
  auVar4 = ZEXT416((uint)(auVar4._0_4_ + fVar10 * fVar10));
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  fVar5 = auVar4._0_4_;
  auVar18._4_4_ = fVar5;
  auVar18._0_4_ = fVar5;
  auVar18._8_4_ = fVar5;
  auVar18._12_4_ = fVar5;
  auVar4 = vdivps_avx(auVar7,auVar18);
  local_88 = auVar4;
  if (bVar2 != false) {
    local_88._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
    local_88._8_4_ = auVar4._8_4_ ^ 0x80000000;
    local_88._12_4_ = auVar4._12_4_ ^ 0x80000000;
  }
  local_78._0_4_ =
       (uint)(bVar2 & 1) * (int)-(fVar10 / fVar5) + (uint)!(bool)(bVar2 & 1) * (int)(fVar10 / fVar5)
  ;
  local_78._4_12_ = auVar3._4_12_;
  local_94.super_Tuple3<pbrt::Point3,_float>.x = auVar6._0_4_;
  Point3fi::Point3fi(&local_38,&local_94,(Vector3f *)&local_68);
  Transform::operator()((Point3fi *)__return_storage_ptr__,this_00,&local_38);
  fVar5 = this->zMax;
  fVar10 = this->phiMax;
  fVar11 = this->radius;
  fVar12 = this->zMin;
  __return_storage_ptr__->set = true;
  auVar13._0_12_ = ZEXT812(0);
  auVar13._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar13;
  uVar1 = vmovlps_avx(local_88);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar1;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_78._0_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar13;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / (fVar10 * fVar11 * (fVar5 - fVar12));
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> Sphere::Sample(Point2f u) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * SampleUniformSphere(u);
    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / Distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * Abs((Vector3f)pObj);

    // Compute surface normal for sphere sample and return _ShapeSample_
    Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseOrientation)
        n *= -1;
    Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
    return ShapeSample{Interaction(pi, n), 1 / Area()};
}